

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

json * __thiscall
argo::json::append(json *this,unique_ptr<argo::json,_std::default_delete<argo::json>_> *j)

{
  json *pjVar1;
  _Head_base<0UL,_argo::json_*,_false> _Var2;
  json_exception *this_00;
  char *json_type_name;
  pointer *__ptr;
  _Head_base<0UL,_argo::json_*,_false> local_18;
  
  if (this->m_type == array_e) {
    pjVar1 = (j->_M_t).super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
             super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
             super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
    (j->_M_t).super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
    super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
    super__Head_base<0UL,_argo::json_*,_false>._M_head_impl = (json *)0x0;
    local_18._M_head_impl = pjVar1;
    std::
    vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
    ::emplace_back<std::unique_ptr<argo::json,std::default_delete<argo::json>>>
              ((vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
                *)&(this->m_value).u_object,
               (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_18);
    _Var2._M_head_impl = local_18._M_head_impl;
    if (local_18._M_head_impl != (json *)0x0) {
      ~json(local_18._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
    return pjVar1;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_type_name = get_instance_type_name(this);
  json_exception::json_exception(this_00,not_an_array_e,json_type_name);
  __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
}

Assistant:

const json &json::append(unique_ptr<json> j)
{
    if (m_type == array_e)
    {
        json *jp = j.release();
        m_value.u_array.push_back(unique_ptr<json>(jp));
        return *jp;
    }
    else
    {
        throw json_exception(json_exception::not_an_array_e, get_instance_type_name());
    }
}